

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregator::WindowAggregator(WindowAggregator *this,BoundWindowExpression *wexpr)

{
  pointer puVar1;
  idx_t iVar2;
  pointer pEVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this_00;
  
  this->_vptr_WindowAggregator = (_func_int **)&PTR__WindowCustomAggregator_027cab48;
  this->wexpr = wexpr;
  AggregateObject::AggregateObject(&this->aggr,wexpr);
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LogicalType::LogicalType(&this->result_type,&(wexpr->super_Expression).return_type);
  iVar2 = (*(this->aggr).function.state_size)(&(this->aggr).function);
  this->state_size = iVar2;
  this->exclude_mode = wexpr->exclude_clause;
  (this->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  puVar1 = (wexpr->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (wexpr->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&this->arg_types,
               &pEVar3->return_type);
  }
  return;
}

Assistant:

WindowAggregator::WindowAggregator(const BoundWindowExpression &wexpr)
    : wexpr(wexpr), aggr(wexpr), result_type(wexpr.return_type), state_size(aggr.function.state_size(aggr.function)),
      exclude_mode(wexpr.exclude_clause) {

	for (auto &child : wexpr.children) {
		arg_types.emplace_back(child->return_type);
	}
}